

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O2

void fft2dFree(void)

{
  long lVar1;
  
  for (lVar1 = 0x3f; -1 < lVar1; lVar1 = lVar1 + -1) {
    if (Array2d[lVar1] != (float *)0x0) {
      free(Array2d[lVar1]);
      Array2d[lVar1] = (float *)0x0;
    }
  }
  fftFree();
  return;
}

Assistant:

void fft2dFree(){
// free storage for columns of 2d ffts and call fftFree to free all BRLow and Utbl storage
long i1;
for (i1=8*sizeof(long)-1; i1>=0; i1--){
	if (Array2d[i1] != 0){
		free(Array2d[i1]);
		Array2d[i1] = 0;
	};
};
fftFree();
}